

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::
     outer_product_selector_run<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false>,Eigen::Matrix<double,1,1,0,1,1>,2>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false>,Eigen::Matrix<double,1,1,0,1,1>,2>::set>
               (GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_2>
                *prod,Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dest,
               set *func,false_type *param_4)

{
  false_type *this;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  Scalar *scalar;
  StorageBaseType *matrix;
  ScalarMultipleReturnType local_c0;
  ColXpr local_70;
  long local_38;
  Index j;
  Index cols;
  false_type *param_3_local;
  set *func_local;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dest_local;
  GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_2>
  *prod_local;
  
  cols = (Index)param_4;
  param_3_local = (false_type *)func;
  func_local = (set *)dest;
  dest_local = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)prod;
  j = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::cols
                ((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)dest);
  for (local_38 = 0; this = param_3_local, local_38 < j; local_38 = local_38 + 1) {
    DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::col
              (&local_70,
               (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)func_local,local_38);
    this_00 = &ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_2>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
               ::rhs((ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_2>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                      *)dest_local)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>;
    scalar = PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::coeff(this_00,0,local_38);
    matrix = (StorageBaseType *)
             ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_2>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
             ::lhs((ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_2>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                    *)dest_local);
    Eigen::operator*(&local_c0,scalar,matrix);
    GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,false>,Eigen::Matrix<double,1,1,0,1,1>,2>
    ::set::operator()(this,&local_70,&local_c0);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void outer_product_selector_run(const ProductType& prod, Dest& dest, const Func& func, const false_type&)
{
  typedef typename Dest::Index Index;
  // FIXME make sure lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dest.cols();
  for (Index j=0; j<cols; ++j)
    func(dest.col(j), prod.rhs().coeff(0,j) * prod.lhs());
}